

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
* __thiscall dg::DODRanganath::compute(DODRanganath *this,CDGraph *graph)

{
  bool bVar1;
  CDNode *m_00;
  iterator p_00;
  iterator G;
  reference ppCVar2;
  CDGraph *pCVar3;
  __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
  from;
  iterator n_00;
  CDGraph *G_00;
  CDGraph *in_RDX;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  *in_RSI;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::CDNode_*>,_bool> pVar4;
  ContainedType *p;
  node_iterator __end4;
  node_iterator __begin4;
  CDGraph *__range4;
  ContainedType *m;
  node_iterator __end3;
  node_iterator __begin3;
  CDGraph *__range3;
  CDNode *n;
  iterator __end2;
  iterator __begin2;
  PredicatesT *__range2;
  ResultT revCD;
  ResultT CD;
  CDGraph *in_stack_fffffffffffffec8;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  *__x;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff11;
  iterator local_a8 [2];
  CDNode *local_98;
  CDNode *in_stack_ffffffffffffff88;
  DODRanganath *in_stack_ffffffffffffff90;
  
  __x = in_RDI;
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::map((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
         *)0x14cf66);
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::map((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
         *)0x14cf73);
  CDGraph::size((CDGraph *)0x14cf80);
  std::
  unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
  ::reserve((unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
             *)in_RDI,(size_type)in_stack_fffffffffffffec8);
  m_00 = (CDNode *)CDGraph::predicates(in_RDX);
  p_00 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::begin
                   ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                    in_stack_fffffffffffffec8);
  G = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::end
                ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                 in_stack_fffffffffffffec8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff78,(_Self *)&stack0xffffffffffffff70
                                ), bVar1) {
    ppCVar2 = std::_Rb_tree_const_iterator<dg::CDNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::CDNode_*> *)0x14cff7);
    local_98 = *ppCVar2;
    local_a8[0]._M_current =
         (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
         CDGraph::begin(in_stack_fffffffffffffec8);
    CDGraph::end(in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      pCVar3 = (CDGraph *)CDGraph::node_iterator::operator*((node_iterator *)0x14d067);
      from._M_current =
           (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
           CDGraph::begin(in_stack_fffffffffffffec8);
      n_00._M_current =
           (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
           CDGraph::end(in_stack_fffffffffffffec8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                                 *)in_RDI,
                                (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                                 *)in_stack_fffffffffffffec8), bVar1) {
        G_00 = (CDGraph *)CDGraph::node_iterator::operator*((node_iterator *)0x14d0bc);
        if ((((G_00 != pCVar3) &&
             (bVar1 = onallpaths((CDNode *)from._M_current,(CDNode *)n_00._M_current,G_00), bVar1))
            && (bVar1 = onallpaths((CDNode *)from._M_current,(CDNode *)n_00._M_current,G_00), bVar1)
            ) && (bVar1 = dependence(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,m_00,
                                     (CDNode *)p_00._M_node,(CDGraph *)G._M_node), bVar1)) {
          std::
          map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                       (key_type *)in_stack_ffffffffffffff08._M_node);
          std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                    ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                     CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),
                     (value_type *)in_stack_fffffffffffffee8._M_node);
          std::
          map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                       (key_type *)in_stack_ffffffffffffff08._M_node);
          pVar4 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::
                  insert((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),
                         (value_type *)in_stack_fffffffffffffee8._M_node);
          in_stack_ffffffffffffff08 = pVar4.first._M_node;
          in_stack_ffffffffffffff10 = pVar4.second;
          std::
          map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                       (key_type *)in_stack_ffffffffffffff08._M_node);
          std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                    ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                     CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),
                     (value_type *)in_stack_fffffffffffffee8._M_node);
          std::
          map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                       (key_type *)in_stack_ffffffffffffff08._M_node);
          pVar4 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::
                  insert((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),
                         (value_type *)in_stack_fffffffffffffee8._M_node);
          in_stack_fffffffffffffee8 = pVar4.first._M_node;
          in_stack_fffffffffffffef0 = pVar4.second;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
        ::operator++((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                      *)&stack0xffffffffffffff38);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
      ::operator++(local_a8);
    }
    std::_Rb_tree_const_iterator<dg::CDNode_*>::operator++
              ((_Rb_tree_const_iterator<dg::CDNode_*> *)in_RDI);
  }
  std::
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  ::
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_&,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_&,_true>
            (in_RSI,&__x->first,&in_RDI->first);
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::~map((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          *)0x14d260);
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::~map((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
          *)0x14d26d);
  return __x;
}

Assistant:

std::pair<ResultT, ResultT> compute(CDGraph &graph) {
        ResultT CD;
        ResultT revCD;

        DBG(cda, "Computing DOD (Ranganath)");

        data.reserve(graph.size());

        for (auto *n : graph.predicates()) {
            for (auto *m : graph) {
                for (auto *p : graph) {
                    if (p == m) {
                        continue;
                    }

                    if (onallpaths(m, p, graph) && onallpaths(p, m, graph) &&
                        dependence(n, p, m, graph)) {
                        // DBG(cda, "DOD: " << n->getID() << " -> {"
                        //                 << p->getID() << ", " << m->getID()
                        //                 << "}");
                        CD[m].insert(n);
                        CD[p].insert(n);
                        revCD[n].insert(m);
                        revCD[n].insert(n);
                    }
                }
            }
        }

        return {CD, revCD};
    }